

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted-payload.c
# Opt level: O1

int ndn_parse_encrypted_payload
              (uint8_t *input,uint32_t input_size,uint8_t *output,uint32_t *output_size,
              uint32_t aes_key_id)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ndn_aes_key_t *aes_key;
  long lVar6;
  uint8_t *puVar7;
  uint uVar8;
  ulong uVar9;
  uint8_t *input_value;
  uint32_t input_size_00;
  uint8_t *aes_iv;
  uint uVar10;
  uint uVar11;
  
  uVar9 = 0;
  uVar10 = 0;
  uVar11 = 0;
  input_size_00 = 0;
  aes_iv = (uint8_t *)0x0;
  input_value = (uint8_t *)0x0;
  puVar7 = output;
  do {
    iVar5 = (int)uVar9;
    bVar1 = input[uVar9];
    if (bVar1 < 0xfd) {
      uVar9 = (ulong)(iVar5 + 1);
      iVar3 = 0;
      bVar2 = true;
      uVar11 = (uint)bVar1;
    }
    else {
      if ((input_size - iVar5 < 3) || (bVar1 != 0xfd)) {
        bVar2 = false;
        iVar3 = -0xe;
        if ((input_size - iVar5 < 5) || (bVar1 != 0xfe)) goto LAB_0010b3f2;
        uVar11 = (uint)input[iVar5 + 4] |
                 (uint)input[iVar5 + 3] << 8 |
                 (uint)input[iVar5 + 2] << 0x10 | (uint)input[iVar5 + 1] << 0x18;
        uVar8 = iVar5 + 5;
      }
      else {
        uVar11 = (uint)CONCAT11(input[iVar5 + 1],input[iVar5 + 2]);
        uVar8 = iVar5 + 3;
      }
      uVar9 = (ulong)uVar8;
      iVar3 = 0;
      bVar2 = true;
    }
LAB_0010b3f2:
    if (!bVar2) {
      return iVar3;
    }
    iVar5 = (int)uVar9;
    bVar1 = input[uVar9];
    if (bVar1 < 0xfd) {
      uVar9 = (ulong)(iVar5 + 1);
      iVar3 = 0;
      bVar2 = true;
      uVar10 = (uint)bVar1;
    }
    else {
      if ((input_size - iVar5 < 3) || (bVar1 != 0xfd)) {
        bVar2 = false;
        iVar3 = -0xe;
        if ((input_size - iVar5 < 5) || (bVar1 != 0xfe)) goto LAB_0010b48f;
        uVar10 = (uint)input[iVar5 + 4] |
                 (uint)input[iVar5 + 3] << 8 |
                 (uint)input[iVar5 + 2] << 0x10 | (uint)input[iVar5 + 1] << 0x18;
        uVar8 = iVar5 + 5;
      }
      else {
        uVar10 = (uint)CONCAT11(input[iVar5 + 1],input[iVar5 + 2]);
        uVar8 = iVar5 + 3;
      }
      uVar9 = (ulong)uVar8;
      iVar3 = 0;
      bVar2 = true;
    }
LAB_0010b48f:
    if (!bVar2) {
      return iVar3;
    }
    uVar8 = (uint)uVar9;
    if (uVar11 == 0x81) {
      uVar4 = 0;
      if (uVar8 + 4 <= input_size) {
        uVar4 = 0;
        lVar6 = 0x20;
        do {
          lVar6 = lVar6 + -8;
          uVar4 = uVar4 + ((uint)input[uVar9] << ((byte)lVar6 & 0x1f));
          uVar9 = (ulong)((int)uVar9 + 1);
        } while (lVar6 != 0);
        uVar9 = (ulong)(uVar8 + 4);
      }
      if (uVar4 - aes_key_id != 0) {
        printf("ERROR: %s, L%d: ","ndn_parse_encrypted_payload",0x75);
        printf("[ENCODING] Received KeyID %u and Input KeyID %u not match\n",(ulong)uVar4,
               (ulong)aes_key_id);
        puVar7 = (uint8_t *)(ulong)(uVar4 - aes_key_id);
      }
      if (uVar4 != aes_key_id) {
        return (int)puVar7;
      }
    }
    else if (uVar11 == 0x88) {
      input_value = input + uVar9;
      uVar4 = uVar10 + uVar8;
      if (input_size < uVar10 + uVar8) {
        uVar4 = uVar8;
      }
      uVar9 = (ulong)uVar4;
      input_size_00 = uVar10;
    }
    else {
      if (uVar11 == 0x87) {
        if (uVar10 != 0x10) {
          return -0xd;
        }
        aes_iv = input + uVar9;
        uVar4 = uVar8 + 0x10;
      }
      else {
        uVar4 = uVar10 + uVar8;
      }
      if (input_size < uVar4) {
        uVar4 = uVar8;
      }
      uVar9 = (ulong)uVar4;
    }
    if (input_value != (uint8_t *)0x0 && aes_iv != (uint8_t *)0x0) {
      aes_key = ndn_key_storage_get_aes_key(aes_key_id);
      if (aes_key == (ndn_aes_key_t *)0x0) {
        return -0x49;
      }
      iVar5 = ndn_aes_cbc_decrypt(input_value,input_size_00,output,output_size,aes_iv,aes_key);
      return iVar5;
    }
  } while( true );
}

Assistant:

int
ndn_parse_encrypted_payload(const uint8_t* input, uint32_t input_size,
                            uint8_t* output, uint32_t* output_size, uint32_t aes_key_id)
{
  int ret_val = -1;
  uint32_t type = 0;
  uint32_t length = 0;
  uint32_t encrypted_payload_length = 0;
  const uint8_t* iv = NULL;
  const uint8_t* encrypted_payload = NULL;
  ndn_decoder_t decoder;
  decoder_init(&decoder, input, input_size);

  do {
    ret_val = decoder_get_type(&decoder, &type);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = decoder_get_length(&decoder, &length);
    if (ret_val != NDN_SUCCESS) return ret_val;
    if (type == TLV_AC_AES_IV) {
      if (length != NDN_AES_BLOCK_SIZE) return NDN_WRONG_TLV_LENGTH;
      iv = decoder.input_value + decoder.offset;
      decoder_move_forward(&decoder, length);
    }
    else if (type == TLV_AC_KEYID) {
      uint32_t keyid = 0;
      decoder_get_uint32_value(&decoder, &keyid);
      if (keyid != aes_key_id) {
        NDN_LOG_ERROR("[ENCODING] Received KeyID %u and Input KeyID %u not match\n", keyid, aes_key_id);
        return keyid - aes_key_id;
      }
    }
    else if (type == TLV_AC_ENCRYPTED_PAYLOAD) {
      encrypted_payload = decoder.input_value + decoder.offset;
      encrypted_payload_length = length;
      decoder_move_forward(&decoder, length);
    }
    else {
      decoder_move_forward(&decoder, length);
    }
  }
  while (iv == NULL || encrypted_payload == NULL);

  ndn_aes_key_t* key = ndn_key_storage_get_aes_key(aes_key_id);
  if (key == NULL) {
    return NDN_AC_KEY_NOT_FOUND;
  }
  ret_val = ndn_aes_cbc_decrypt(encrypted_payload, encrypted_payload_length,
                                output, output_size, iv, key);
  if (ret_val != NDN_SUCCESS) return ret_val;
  return 0;
}